

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Bloaty::ScanAndRollupFiles
          (Bloaty *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *build_ids,Rollup *rollup)

{
  _Alloc_hider __p;
  bool bVar1;
  int iVar2;
  pointer other;
  long lVar3;
  int iVar4;
  size_type __n;
  pointer pPVar5;
  unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> regex;
  string error;
  thread local_c0;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<PerThreadData,_std::allocator<PerThreadData>_> local_a0;
  ThreadSafeIterIndex index;
  
  iVar2 = std::thread::hardware_concurrency();
  iVar4 = (int)((ulong)((long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(filenames->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (iVar2 < iVar4) {
    iVar4 = iVar2;
  }
  if (iVar4 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  __n = (size_type)iVar4;
  if (iVar4 == 0) {
    other = (pointer)0x0;
  }
  else {
    other = (pointer)operator_new(__n * 0x78);
  }
  local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = other + __n;
  local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
  super__Vector_impl_data._M_finish = other;
  for (lVar3 = -__n; lVar3 != 0; lVar3 = lVar3 + 1) {
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).filter_regex_ = (ReImpl *)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_buckets = (__buckets_ptr)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_bucket_count = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_element_count = 0;
    *(undefined8 *)
     &((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).filtered_vm_total_ = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).filtered_file_total_ = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).vm_total_ = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).file_total_ = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_buckets =
         &((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
            super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_single_bucket;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_bucket_count = 1;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_element_count = 0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy._M_max_load_factor
         = 1.0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->build_ids).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy._M_next_resize = 0
    ;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->build_ids).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish)->build_ids).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_a0.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
  super__Vector_impl_data._M_start = other;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&threads,__n,(allocator_type *)&index);
  index.index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  index.error_._M_dataplus._M_p = (pointer)&index.error_.field_2;
  index.error_._M_string_length = 0;
  index.error_.field_2._M_local_buf[0] = '\0';
  index.mutex_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  index.mutex_.super___mutex_base._M_mutex.__align = 0;
  index.mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  regex._M_t.super___uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>._M_t.
  super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
  super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>,_true,_true>)
       (__uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>)0x0;
  index.mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  index.mutex_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  index.max_ = (int)((ulong)((long)(filenames->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(filenames->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (((this->options_)._has_bits_.has_bits_[0] & 2) != 0) {
    std::make_unique<bloaty::ReImpl,std::__cxx11::string_const&>(&error);
    __p = error._M_dataplus;
    error._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::reset
              ((__uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&regex,
               (pointer)__p._M_p);
    std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
              ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&error);
  }
  pPVar5 = other;
  for (lVar3 = 0; __n * 8 != lVar3; lVar3 = lVar3 + 8) {
    (pPVar5->rollup).filter_regex_ =
         (ReImpl *)
         regex._M_t.super___uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>._M_t
         .super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
         super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl;
    local_c0._M_id._M_thread = (id)0;
    error._M_dataplus._M_p = (pointer)operator_new(0x28);
    *(undefined ***)error._M_dataplus._M_p = &PTR___State_005bb2b8;
    *(pointer *)(error._M_dataplus._M_p + 8) = pPVar5;
    *(Bloaty **)(error._M_dataplus._M_p + 0x10) = this;
    *(ThreadSafeIterIndex **)(error._M_dataplus._M_p + 0x18) = &index;
    *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(error._M_dataplus._M_p + 0x20) = filenames;
    std::thread::_M_start_thread(&local_c0,&error,0);
    if (error._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)error._M_dataplus._M_p + 8))();
    }
    std::thread::operator=
              ((thread *)
               ((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar3),
               &local_c0);
    std::thread::~thread(&local_c0);
    pPVar5 = pPVar5 + 1;
  }
  for (lVar3 = 0; __n * 8 != lVar3; lVar3 = lVar3 + 8) {
    std::thread::join();
    if (lVar3 == 0) {
      Rollup::operator=(rollup,&other->rollup);
    }
    else {
      Rollup::Add(rollup,&other->rollup);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)build_ids,
               (build_ids->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (other->build_ids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (other->build_ids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    other = other + 1;
  }
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar1 = ThreadSafeIterIndex::TryGetError(&index,&error);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&error);
    std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr(&regex);
    std::__cxx11::string::~string((string *)&index.error_);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    std::vector<PerThreadData,_std::allocator<PerThreadData>_>::~vector(&local_a0);
    return;
  }
  Throw(error._M_dataplus._M_p,0x760);
}

Assistant:

void Bloaty::ScanAndRollupFiles(const std::vector<std::string>& filenames,
                                std::vector<std::string>* build_ids,
                                Rollup* rollup) const {
  int num_cpus = std::thread::hardware_concurrency();
  int num_threads = std::min(num_cpus, static_cast<int>(filenames.size()));

  struct PerThreadData {
    Rollup rollup;
    std::vector<std::string> build_ids;
  };

  std::vector<PerThreadData> thread_data(num_threads);
  std::vector<std::thread> threads(num_threads);
  ThreadSafeIterIndex index(filenames.size());

  std::unique_ptr<ReImpl> regex = nullptr;
  if (options_.has_source_filter()) {
    regex = absl::make_unique<ReImpl>(options_.source_filter());
  }

  for (int i = 0; i < num_threads; i++) {
    thread_data[i].rollup.SetFilterRegex(regex.get());

    threads[i] = std::thread(
        [this, &index, &filenames](PerThreadData* data) {
          try {
            int j;
            while (index.TryGetNext(&j)) {
              ScanAndRollupFile(filenames[j], &data->rollup, &data->build_ids);
            }
          } catch (const bloaty::Error& e) {
            index.Abort(e.what());
          }
        },
        &thread_data[i]);
  }

  for (int i = 0; i < num_threads; i++) {
    threads[i].join();
    PerThreadData* data = &thread_data[i];
    if (i == 0) {
      *rollup = std::move(data->rollup);
    } else {
      rollup->Add(data->rollup);
    }

    build_ids->insert(build_ids->end(), data->build_ids.begin(),
                      data->build_ids.end());
  }

  std::string error;
  if (index.TryGetError(&error)) {
    THROW(error.c_str());
  }
}